

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_random.c
# Opt level: O0

void arc4_stir(void)

{
  int __fd;
  ssize_t sVar1;
  bool bVar2;
  undefined1 local_b0 [8];
  anon_struct_152_3_0413aac1 rdat;
  int i;
  int fd;
  int done;
  
  if (rs_initialized == 0) {
    arc4_init();
    rs_initialized = 1;
  }
  bVar2 = false;
  __fd = open("/dev/urandom",0x80000,0);
  if (-1 < __fd) {
    sVar1 = read(__fd,local_b0,0x80);
    bVar2 = sVar1 == 0x80;
    close(__fd);
  }
  if (!bVar2) {
    gettimeofday((timeval *)local_b0,(__timezone_ptr_t)0x0);
    rdat.tv.tv_usec._0_4_ = getpid();
  }
  arc4_addrandom(local_b0,0x80);
  for (rdat._148_4_ = 0; (int)rdat._148_4_ < 0xc00; rdat._148_4_ = rdat._148_4_ + 1) {
    arc4_getbyte();
  }
  arc4_count = 1600000;
  return;
}

Assistant:

static void
arc4_stir(void)
{
	int done, fd, i;
	struct {
		struct timeval	tv;
		pid_t		pid;
		u_char	 	rnd[KEYSIZE];
	} rdat;

	if (!rs_initialized) {
		arc4_init();
		rs_initialized = 1;
	}
	done = 0;
	fd = open(RANDOMDEV, O_RDONLY | O_CLOEXEC, 0);
	if (fd >= 0) {
		if (read(fd, &rdat, KEYSIZE) == KEYSIZE)
			done = 1;
		(void)close(fd);
	}
	if (!done) {
		(void)gettimeofday(&rdat.tv, NULL);
		rdat.pid = getpid();
		/* We'll just take whatever was on the stack too... */
	}

	arc4_addrandom((u_char *)&rdat, KEYSIZE);

	/*
	 * Discard early keystream, as per recommendations in:
	 * "(Not So) Random Shuffles of RC4" by Ilya Mironov.
	 * As per the Network Operations Division, cryptographic requirements
	 * published on wikileaks on March 2017.
	 */

	for (i = 0; i < 3072; i++)
		(void)arc4_getbyte();
	arc4_count = 1600000;
}